

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct(void *ptr)

{
  long lVar1;
  undefined8 uVar2;
  
  lVar1 = *(long *)((long)ptr + 0x28);
  if (lVar1 != 0) {
    uVar2 = *(undefined8 *)((long)ptr + 0x30);
    *(undefined8 *)((long)ptr + 0x28) = 0;
    *(undefined8 *)((long)ptr + 0x30) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x38))
              (*(undefined8 **)((long)ptr + 0x38),lVar1,0x40,uVar2,uVar2,destruct);
  }
  lVar1 = *(long *)((long)ptr + 0x10);
  if (lVar1 != 0) {
    uVar2 = *(undefined8 *)((long)ptr + 0x18);
    *(undefined8 *)((long)ptr + 0x10) = 0;
    *(undefined8 *)((long)ptr + 0x18) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x20))
              (*(undefined8 **)((long)ptr + 0x20),lVar1,1,uVar2,uVar2,0);
  }
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }